

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O0

int __thiscall Fl_Bitmap::copy(Fl_Bitmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  int H;
  int W;
  int ystep;
  int xstep;
  int ymod;
  int xmod;
  int yerr;
  int xerr;
  int dy;
  int dx;
  int sy;
  int sx;
  uchar *old_ptr;
  uchar old_bit;
  byte *pbStack_48;
  uchar new_bit;
  uchar *new_ptr;
  uchar *new_array;
  Fl_Bitmap *new_image;
  int H_local;
  int W_local;
  Fl_Bitmap *this_local;
  
  W = (int)dst;
  H = (int)src;
  iVar1 = Fl_Image::w(&this->super_Fl_Image);
  if ((W == iVar1) && (iVar1 = Fl_Image::h(&this->super_Fl_Image), H == iVar1)) {
    iVar1 = W + 7;
    if (W + 7 < 0) {
      iVar1 = W + 0xe;
    }
    puVar6 = (uchar *)operator_new__((long)(H * (iVar1 >> 3)));
    iVar1 = W + 7;
    if (W + 7 < 0) {
      iVar1 = W + 0xe;
    }
    memcpy(puVar6,this->array,(long)(H * (iVar1 >> 3)));
    this_local = (Fl_Bitmap *)operator_new(0x38);
    Fl_Bitmap(this_local,puVar6,W,H);
    this_local->alloc_array = 1;
  }
  else if ((W < 1) || (H < 1)) {
    this_local = (Fl_Bitmap *)0x0;
  }
  else {
    iVar2 = Fl_Image::w(&this->super_Fl_Image);
    iVar3 = Fl_Image::w(&this->super_Fl_Image);
    iVar4 = Fl_Image::h(&this->super_Fl_Image);
    iVar5 = Fl_Image::h(&this->super_Fl_Image);
    iVar1 = W + 7;
    if (W + 7 < 0) {
      iVar1 = W + 0xe;
    }
    pbStack_48 = (byte *)operator_new__((long)(H * (iVar1 >> 3)));
    this_local = (Fl_Bitmap *)operator_new(0x38);
    Fl_Bitmap(this_local,pbStack_48,W,H);
    this_local->alloc_array = 1;
    memset(pbStack_48,0,(long)(H * ((W + 7) / 8)));
    dy = 0;
    ymod = H;
    for (yerr = H; 0 < yerr; yerr = yerr + -1) {
      puVar6 = this->array;
      iVar1 = Fl_Image::w(&this->super_Fl_Image);
      dx = 0;
      old_ptr._7_1_ = 1;
      xmod = W;
      for (xerr = W; 0 < xerr; xerr = xerr + -1) {
        if ((puVar6[(long)(dx / 8) + (long)(dy * ((iVar1 + 7) / 8))] & (byte)(1 << ((byte)dx & 7)))
            != 0) {
          *pbStack_48 = *pbStack_48 | old_ptr._7_1_;
        }
        if (old_ptr._7_1_ < 0x80) {
          old_ptr._7_1_ = old_ptr._7_1_ << 1;
        }
        else {
          old_ptr._7_1_ = 1;
          pbStack_48 = pbStack_48 + 1;
        }
        dx = iVar3 / W + dx;
        xmod = xmod - iVar2 % W;
        if (xmod < 1) {
          xmod = W + xmod;
          dx = dx + 1;
        }
      }
      if (1 < old_ptr._7_1_) {
        pbStack_48 = pbStack_48 + 1;
      }
      dy = iVar5 / H + dy;
      ymod = ymod - iVar4 % H;
      if (ymod < 1) {
        ymod = H + ymod;
        dy = dy + 1;
      }
    }
  }
  return (int)this_local;
}

Assistant:

Fl_Image *Fl_Bitmap::copy(int W, int H) {
  Fl_Bitmap	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    new_array = new uchar [H * ((W + 7) / 8)];
    memcpy(new_array, array, H * ((W + 7) / 8));

    new_image = new Fl_Bitmap(new_array, W, H);
    new_image->alloc_array = 1;

    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and 
  uchar		*new_ptr,	// Pointer into new array
		new_bit,	// Bit for new array
		old_bit;	// Bit for old array
  const uchar	*old_ptr;	// Pointer into old array
  int		sx, sy,		// Source coordinates
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments


  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = w() / W;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new image...
  new_array = new uchar [H * ((W + 7) / 8)];
  new_image = new Fl_Bitmap(new_array, W, H);
  new_image->alloc_array = 1;

  memset(new_array, 0, H * ((W + 7) / 8));

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
    for (dx = W, xerr = W, old_ptr = array + sy * ((w() + 7) / 8), sx = 0, new_bit = 1;
	 dx > 0;
	 dx --) {
      old_bit = (uchar)(1 << (sx & 7));
      if (old_ptr[sx / 8] & old_bit) *new_ptr |= new_bit;

      if (new_bit < 128) new_bit <<= 1;
      else {
        new_bit = 1;
	new_ptr ++;
      }

      sx   += xstep;
      xerr -= xmod;

      if (xerr <= 0) {
	xerr += W;
	sx ++;
      }
    }

    if (new_bit > 1) new_ptr ++;

    sy   += ystep;
    yerr -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  return new_image;
}